

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> __thiscall
slang::parsing::Parser::
parseMemberList<slang::syntax::MemberSyntax,slang::parsing::Parser::parseCoverCross(nonstd::span_lite::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>,slang::syntax::NamedLabelSyntax*)::__0>
          (Parser *this,TokenKind endKind,Token *endToken,SyntaxKind parentKind,
          anon_class_8_1_8991fb9c *parseFunc)

{
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> sVar1;
  int iVar2;
  enable_if_t<is_constructible_v<decay_t<const_DiagCode_&>,_const_slang::DiagCode_&>,_optional<decay_t<const_DiagCode_&>_>_>
  eVar3;
  undefined4 extraout_var;
  size_type extraout_RDX;
  optional<slang::DiagCode> diagCode;
  Token TVar4;
  _Storage<slang::DiagCode,_true> local_ce;
  undefined2 local_ca;
  MemberSyntax *local_c8;
  MemberSyntax *member;
  Token local_b0;
  TokenKind local_9c;
  bool local_9a;
  byte local_99;
  undefined1 local_98 [4];
  TokenKind kind;
  bool anyLocalModules;
  bool errored;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL> members;
  anon_class_8_1_8991fb9c *parseFunc_local;
  SyntaxKind parentKind_local;
  Token *endToken_local;
  TokenKind endKind_local;
  Parser *this_local;
  
  members.stackBase._48_8_ = parseFunc;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL>::SmallVector
            ((SmallVector<slang::syntax::MemberSyntax_*,_8UL> *)local_98);
  local_99 = 0;
  local_9a = false;
  while( true ) {
    TVar4 = ParserBase::peek(&this->super_ParserBase);
    local_b0.kind = TVar4.kind;
    local_9c = local_b0.kind;
    local_b0 = TVar4;
    if ((local_b0.kind == EndOfFile) || (local_b0.kind == endKind)) break;
    local_c8 = parseCoverCross::anon_class_8_1_8991fb9c::operator()
                         ((anon_class_8_1_8991fb9c *)members.stackBase._48_8_,parentKind,&local_9a);
    if (local_c8 == (MemberSyntax *)0x0) {
      if ((local_99 & 1) == 0) {
        eVar3 = std::make_optional<slang::DiagCode_const&>((DiagCode *)&slang::diag::ExpectedMember)
        ;
        local_ce = eVar3.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
                   super__Optional_payload_base<slang::DiagCode>._M_payload;
        local_ca = eVar3.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
                   super__Optional_payload_base<slang::DiagCode>._4_2_;
      }
      else {
        std::optional<slang::DiagCode>::optional((optional<slang::DiagCode> *)&local_ce);
      }
      diagCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
      super__Optional_payload_base<slang::DiagCode>._4_2_ = local_ca;
      diagCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
      super__Optional_payload_base<slang::DiagCode>._M_payload = local_ce;
      ParserBase::skipToken(&this->super_ParserBase,diagCode);
      local_99 = 1;
    }
    else {
      checkMemberAllowed(this,&local_c8->super_SyntaxNode,parentKind);
      SmallVectorBase<slang::syntax::MemberSyntax_*>::push_back
                ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)local_98,&local_c8);
      local_99 = 0;
    }
  }
  if ((local_9a & 1U) != 0) {
    SmallVectorBase<ska::flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::pop_back(&(this->moduleDeclStack).
                super_SmallVectorBase<ska::flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              );
  }
  TVar4 = ParserBase::expect(&this->super_ParserBase,endKind);
  *endToken = TVar4;
  iVar2 = SmallVectorBase<slang::syntax::MemberSyntax_*>::copy
                    ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)local_98,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,TVar4._0_8_);
  sVar1.data_._4_4_ = extraout_var;
  sVar1.data_._0_4_ = iVar2;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL>::~SmallVector
            ((SmallVector<slang::syntax::MemberSyntax_*,_8UL> *)local_98);
  sVar1.size_ = extraout_RDX;
  return sVar1;
}

Assistant:

span<TMember*> Parser::parseMemberList(TokenKind endKind, Token& endToken, SyntaxKind parentKind,
                                       TParseFunc&& parseFunc) {
    SmallVector<TMember*, 8> members;
    bool errored = false;
    bool anyLocalModules = false;

    while (true) {
        auto kind = peek().kind;
        if (kind == TokenKind::EndOfFile || kind == endKind)
            break;

        auto member = parseFunc(parentKind, anyLocalModules);
        if (member) {
            checkMemberAllowed(*member, parentKind);
            members.push_back(member);
            errored = false;
        }
        else {
            skipToken(errored ? std::nullopt : std::make_optional(diag::ExpectedMember));
            errored = true;
        }
    }

    if (anyLocalModules)
        moduleDeclStack.pop_back();

    endToken = expect(endKind);
    return members.copy(alloc);
}